

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Matmul_patch_alt64
               (char transa,char transb,void *alpha,void *beta,int g_a,int64_t *alo,int64_t *ahi,
               int g_b,int64_t *blo,int64_t *bhi,int g_c,int64_t *clo,int64_t *chi)

{
  long g_a_00;
  Integer IVar1;
  Integer IVar2;
  Integer IVar3;
  int in_R8D;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000030;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Integer _ga_chi [7];
  Integer _ga_clo [7];
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  Integer cndim;
  Integer c;
  Integer bndim;
  Integer b;
  Integer andim;
  Integer a;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  long local_1f8 [8];
  long local_1b8 [8];
  long local_178 [8];
  Integer *in_stack_fffffffffffffec8;
  Integer in_stack_fffffffffffffed0;
  void *in_stack_fffffffffffffed8;
  void *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  long local_f8 [5];
  Integer *in_stack_ffffffffffffff30;
  Integer in_stack_ffffffffffffff38;
  Integer *in_stack_ffffffffffffff40;
  Integer *in_stack_ffffffffffffff48;
  Integer in_stack_ffffffffffffff50;
  Integer *in_stack_ffffffffffffff58;
  Integer *in_stack_ffffffffffffff60;
  
  g_a_00 = (long)in_R8D;
  IVar1 = pnga_ndim(g_a_00);
  IVar2 = pnga_ndim(g_a_00);
  IVar3 = pnga_ndim(g_a_00);
  for (local_1fc = 0; local_1fc < IVar1; local_1fc = local_1fc + 1) {
    *(long *)(&stack0xffffffffffffff48 + ((IVar1 - local_1fc) + -1) * 8) =
         *(long *)(in_R9 + (long)local_1fc * 8) + 1;
  }
  for (local_200 = 0; local_200 < IVar1; local_200 = local_200 + 1) {
    local_f8[(IVar1 - local_200) + -1] = *(long *)(in_stack_00000008 + (long)local_200 * 8) + 1;
  }
  for (local_204 = 0; local_204 < IVar2; local_204 = local_204 + 1) {
    *(long *)(&stack0xfffffffffffffec8 + ((IVar2 - local_204) + -1) * 8) =
         *(long *)(in_stack_00000018 + (long)local_204 * 8) + 1;
  }
  for (local_208 = 0; local_208 < IVar2; local_208 = local_208 + 1) {
    local_178[(IVar2 - local_208) + -1] = *(long *)(in_stack_00000020 + (long)local_208 * 8) + 1;
  }
  for (local_20c = 0; local_20c < IVar3; local_20c = local_20c + 1) {
    local_1b8[(IVar3 - local_20c) + -1] = *(long *)(in_stack_00000030 + (long)local_20c * 8) + 1;
  }
  for (local_210 = 0; local_210 < IVar3; local_210 = local_210 + 1) {
    local_1f8[(IVar3 - local_210) + -1] = *(long *)(_i_5 + (long)local_210 * 8) + 1;
  }
  pnga_matmul_patch_alt
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff60);
  return;
}

Assistant:

void NGA_Matmul_patch_alt64(char transa, char transb, void* alpha, void *beta,
                        int g_a, int64_t alo[], int64_t ahi[], 
                        int g_b, int64_t blo[], int64_t bhi[], 
                        int g_c, int64_t clo[], int64_t chi[]) 

{
    Integer a=(Integer)g_a;
    Integer andim = wnga_ndim(a);
    
    Integer b=(Integer)g_b;
    Integer bndim = wnga_ndim(b);
    
    Integer c=(Integer)g_c;
    Integer cndim = wnga_ndim(c);
    
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    Integer _ga_clo[MAXDIM], _ga_chi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);
    
    COPYINDEX_C2F(clo,_ga_clo, cndim);
    COPYINDEX_C2F(chi,_ga_chi, cndim);
    
    wnga_matmul_patch_alt(&transb, &transa, alpha, beta,
		     b, _ga_blo, _ga_bhi,
		     a, _ga_alo, _ga_ahi,
		     c, _ga_clo, _ga_chi);
}